

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

void unit_less(void)

{
  char *in_RAX;
  char *unaff_retaddr;
  
  if (UnitsOn != 0) {
    if (((unitonflag != 0) && (dimensionless(), usp->dim[0] != '\t')) &&
       (1e-05 < ABS(1.0 / usp->factor - 1.0))) {
      fprintf(_stderr,"The previous expression needs the conversion factor (%g)\n",1.0 / usp->factor
             );
      diag(unaff_retaddr,in_RAX);
    }
    unit_pop();
  }
  return;
}

Assistant:

void unit_less() {
	/* ensures top element is dimensionless  with factor 1*/
	IFUNITS
	if (unitonflag) {
		dimensionless();
		if (usp->dim[0]!=9 && OUTTOLERANCE(usp->factor,1.0)) {
fprintf(stderr, "The previous expression needs the conversion factor (%g)\n",
1./(usp->factor));
			diag("", (char *)0);
		}
	}
	unit_pop();
}